

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImTriangleClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar8;
  undefined1 auVar7 [16];
  float fVar9;
  float fVar11;
  ImVec2 IVar10;
  float fVar12;
  float fVar13;
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  float fVar19;
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  
  fVar9 = p->x;
  fVar12 = p->y;
  fVar13 = (*a).x;
  fVar16 = (*a).y;
  fVar20 = (*b).x;
  fVar11 = (*b).y;
  fVar5 = fVar20 - fVar13;
  fVar8 = fVar11 - fVar16;
  fVar3 = (fVar9 - fVar13) * fVar5 + (fVar12 - fVar16) * fVar8;
  if (0.0 <= fVar3) {
    auVar15._0_4_ = fVar5 * fVar5 + fVar8 * fVar8;
    if (fVar3 <= auVar15._0_4_) {
      auVar7._0_4_ = fVar5 * fVar3;
      auVar7._4_4_ = fVar8 * fVar3;
      auVar7._8_4_ = fVar3 * 0.0;
      auVar7._12_4_ = fVar3 * 0.0;
      auVar15._4_4_ = auVar15._0_4_;
      auVar15._8_4_ = auVar15._0_4_;
      auVar15._12_4_ = auVar15._0_4_;
      auVar15 = divps(auVar7,auVar15);
      IVar6.x = auVar15._0_4_ + fVar13;
      IVar6.y = auVar15._4_4_ + fVar16;
    }
    else {
      IVar6 = *b;
    }
  }
  else {
    IVar6 = *a;
  }
  fVar3 = (*c).x;
  fVar5 = (*c).y;
  fVar17 = fVar3 - fVar20;
  fVar19 = fVar5 - fVar11;
  fVar8 = (fVar9 - fVar20) * fVar17 + (fVar12 - fVar11) * fVar19;
  if (0.0 <= fVar8) {
    fVar21 = fVar17 * fVar17 + fVar19 * fVar19;
    if (fVar8 <= fVar21) {
      auVar18._0_4_ = fVar17 * fVar8;
      auVar18._4_4_ = fVar19 * fVar8;
      auVar18._8_4_ = fVar8 * 0.0;
      auVar18._12_4_ = fVar8 * 0.0;
      auVar2._4_4_ = fVar21;
      auVar2._0_4_ = fVar21;
      auVar2._8_4_ = fVar21;
      auVar2._12_4_ = fVar21;
      auVar15 = divps(auVar18,auVar2);
      IVar10.x = fVar20 + auVar15._0_4_;
      IVar10.y = fVar11 + auVar15._4_4_;
    }
    else {
      IVar10 = *c;
    }
  }
  else {
    IVar10 = *b;
  }
  fVar13 = fVar13 - fVar3;
  fVar16 = fVar16 - fVar5;
  fVar8 = (fVar9 - fVar3) * fVar13 + (fVar12 - fVar5) * fVar16;
  if (0.0 <= fVar8) {
    fVar20 = fVar13 * fVar13 + fVar16 * fVar16;
    if (fVar8 <= fVar20) {
      auVar14._0_4_ = fVar13 * fVar8;
      auVar14._4_4_ = fVar16 * fVar8;
      auVar14._8_4_ = fVar8 * 0.0;
      auVar14._12_4_ = fVar8 * 0.0;
      auVar1._4_4_ = fVar20;
      auVar1._0_4_ = fVar20;
      auVar1._8_4_ = fVar20;
      auVar1._12_4_ = fVar20;
      auVar15 = divps(auVar14,auVar1);
      IVar4.x = fVar3 + auVar15._0_4_;
      IVar4.y = fVar5 + auVar15._4_4_;
    }
    else {
      IVar4 = *a;
    }
  }
  else {
    IVar4 = *c;
  }
  fVar3 = fVar9 - IVar6.x;
  fVar5 = fVar12 - IVar6.y;
  fVar8 = fVar3 * fVar3 + fVar5 * fVar5;
  fVar3 = fVar9 - IVar10.x;
  fVar9 = fVar9 - IVar4.x;
  fVar5 = fVar12 - IVar10.y;
  fVar12 = fVar12 - IVar4.y;
  fVar3 = fVar3 * fVar3 + fVar5 * fVar5;
  fVar12 = fVar9 * fVar9 + fVar12 * fVar12;
  fVar9 = fVar3;
  if (fVar12 <= fVar3) {
    fVar9 = fVar12;
  }
  fVar12 = fVar8;
  if (fVar9 <= fVar8) {
    fVar12 = fVar9;
  }
  if ((fVar12 == fVar3) && (!NAN(fVar12) && !NAN(fVar3))) {
    IVar4 = IVar10;
  }
  if ((fVar12 == fVar8) && (!NAN(fVar12) && !NAN(fVar8))) {
    IVar4 = IVar6;
  }
  return IVar4;
}

Assistant:

ImVec2 ImLineClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& p)
{
    ImVec2 ap = p - a;
    ImVec2 ab_dir = b - a;
    float dot = ap.x * ab_dir.x + ap.y * ab_dir.y;
    if (dot < 0.0f)
        return a;
    float ab_len_sqr = ab_dir.x * ab_dir.x + ab_dir.y * ab_dir.y;
    if (dot > ab_len_sqr)
        return b;
    return a + ab_dir * dot / ab_len_sqr;
}